

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_huf.c
# Opt level: O1

exr_result_t
fasthuf_decode(exr_const_context_t_conflict pctxt,FastHufDecoder *fhd,uint8_t *src,
              uint64_t numSrcBits,uint16_t *dst,uint64_t numDstElems)

{
  uint16_t uVar1;
  uint32_t uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  int iVar7;
  int iVar8;
  byte bVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  char *pcVar13;
  ulong *puVar14;
  uint uVar15;
  ulong uVar16;
  ulong *puVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  undefined1 auVar22 [16];
  int iVar23;
  undefined1 auVar24 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  int iVar42;
  int iVar45;
  undefined1 auVar43 [16];
  int iVar46;
  undefined1 auVar44 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  ulong local_78;
  uint32_t local_5c;
  long lVar25;
  
  puVar14 = (ulong *)(src + 0x10);
  uVar18 = numSrcBits - 0x80;
  uVar3 = *(ulong *)src;
  uVar19 = uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
           (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
           (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
  uVar3 = *(ulong *)(src + 8);
  uVar20 = uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
           (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
           (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
  uVar3 = fhd->_tableMin;
  uVar2 = fhd->_rleSymbol;
  iVar7 = 0x40;
  local_78 = 0;
  iVar8 = 0x40;
  auVar50 = _DAT_001848c0;
  auVar51 = _DAT_001848d0;
  auVar52 = _DAT_001848e0;
  auVar53 = _DAT_001848f0;
  auVar54 = _DAT_00184900;
  do {
    if (numDstElems <= local_78) {
      if (uVar18 == 0) {
        return 0;
      }
      if (pctxt == (exr_const_context_t_conflict)0x0) {
        return 0x17;
      }
      (*pctxt->print_error)
                (pctxt,0x17,
                 "Huffman decode error (%d bits of compressed data remains after filling expected output buffer)"
                 ,uVar18 & 0xffffffff);
      return 0x17;
    }
    iVar12 = iVar8;
    if (uVar19 < uVar3) {
      while (iVar12 < 0x40) {
        if (0 < iVar12) {
          iVar11 = 0x40 - iVar12;
          uVar19 = uVar19 | uVar20 >> ((byte)iVar12 & 0x3f);
          if (iVar11 <= iVar7) {
            uVar20 = uVar20 << ((byte)iVar11 & 0x3f);
            iVar8 = 0x40;
            iVar7 = iVar7 - iVar11;
            break;
          }
          iVar7 = iVar12 + iVar7;
          uVar20 = uVar19;
        }
        if (uVar18 < 0x40) {
          if (uVar18 < 8) {
            bVar9 = 0x38;
            uVar21 = 0;
          }
          else {
            uVar19 = uVar18 - 8;
            bVar9 = 0x38;
            uVar21 = 0;
            puVar17 = puVar14;
            do {
              uVar21 = uVar21 | (ulong)(byte)*puVar17 << (bVar9 & 0x3f);
              puVar17 = (ulong *)((long)puVar17 + 1);
              bVar9 = bVar9 - 8;
              uVar18 = uVar18 - 8;
            } while (7 < uVar18);
            puVar14 = (ulong *)((long)puVar14 + (uVar19 >> 3) + 1);
          }
          if (uVar18 != 0) {
            uVar21 = uVar21 | (ulong)(byte)*puVar14 << (bVar9 & 0x3f);
            puVar14 = (ulong *)((long)puVar14 + 1);
            uVar18 = 0;
          }
        }
        else {
          uVar19 = *puVar14;
          uVar21 = uVar19 >> 0x38 | (uVar19 & 0xff000000000000) >> 0x28 |
                   (uVar19 & 0xff0000000000) >> 0x18 | (uVar19 & 0xff00000000) >> 8 |
                   (uVar19 & 0xff000000) << 8 | (uVar19 & 0xff0000) << 0x18 |
                   (uVar19 & 0xff00) << 0x28 | uVar19 << 0x38;
          puVar14 = puVar14 + 1;
          uVar18 = uVar18 - 0x40;
        }
        iVar8 = 0x40;
        uVar19 = uVar20;
        uVar20 = uVar21;
        iVar12 = iVar7;
        iVar7 = 0x40;
      }
      lVar10 = -0x34;
      do {
        lVar25 = lVar10;
        lVar10 = lVar25 + 1;
      } while (uVar19 < fhd->_ljOffset[lVar25 + 5]);
      if (((ulong)fhd->_maxCodeLength < lVar25 + 0x41U) ||
         (uVar21 = (uVar19 >> (-(char)(lVar25 + 1) & 0x3fU)) +
                   *(long *)(fhd->_tableSymbol + lVar25 * 2 + 0xc), fhd->_numSymbols <= uVar21)) {
        if (pctxt == (exr_const_context_t_conflict)0x0) {
          bVar6 = false;
        }
        else {
          (*pctxt->print_error)(pctxt,0x17,"Huffman decode error (Decoded an invalid symbol)");
          bVar6 = false;
          auVar50 = _DAT_001848c0;
          auVar51 = _DAT_001848d0;
          auVar52 = _DAT_001848e0;
          auVar53 = _DAT_001848f0;
          auVar54 = _DAT_00184900;
        }
      }
      else {
        local_5c = fhd->_idToSymbol[uVar21];
        bVar6 = true;
      }
      uVar15 = (uint)(lVar25 + 0x41U);
      if (bVar6) goto LAB_0010d479;
      bVar6 = false;
    }
    else {
      uVar15 = (uint)fhd->_tableCodeLen[uVar19 >> 0x34];
      local_5c = fhd->_tableSymbol[uVar19 >> 0x34];
LAB_0010d479:
      uVar19 = uVar19 << ((byte)uVar15 & 0x3f);
      iVar8 = iVar8 - uVar15;
      if (local_5c == uVar2) {
        uVar21 = uVar19;
        iVar12 = iVar8;
        if (iVar8 < 8) {
          do {
            uVar19 = uVar20;
            if (0 < iVar8) {
              iVar12 = 0x40 - iVar8;
              uVar21 = uVar21 | uVar19 >> ((byte)iVar8 & 0x3f);
              if (iVar12 <= iVar7) {
                uVar20 = uVar19 << ((byte)iVar12 & 0x3f);
                uVar19 = uVar21;
                iVar7 = iVar7 - iVar12;
                iVar12 = 0x40;
                break;
              }
              uVar19 = uVar21;
              iVar7 = iVar8 + iVar7;
            }
            iVar8 = iVar7;
            if (uVar18 < 0x40) {
              if (uVar18 < 8) {
                bVar9 = 0x38;
                uVar20 = 0;
              }
              else {
                uVar21 = uVar18 - 8;
                bVar9 = 0x38;
                uVar20 = 0;
                puVar17 = puVar14;
                do {
                  uVar20 = uVar20 | (ulong)(byte)*puVar17 << (bVar9 & 0x3f);
                  puVar17 = (ulong *)((long)puVar17 + 1);
                  bVar9 = bVar9 - 8;
                  uVar18 = uVar18 - 8;
                } while (7 < uVar18);
                puVar14 = (ulong *)((long)puVar14 + (uVar21 >> 3) + 1);
              }
              if (uVar18 != 0) {
                uVar20 = uVar20 | (ulong)(byte)*puVar14 << (bVar9 & 0x3f);
                puVar14 = (ulong *)((long)puVar14 + 1);
                uVar18 = 0;
              }
            }
            else {
              uVar20 = *puVar14;
              uVar20 = uVar20 >> 0x38 | (uVar20 & 0xff000000000000) >> 0x28 |
                       (uVar20 & 0xff0000000000) >> 0x18 | (uVar20 & 0xff00000000) >> 8 |
                       (uVar20 & 0xff000000) << 8 | (uVar20 & 0xff0000) << 0x18 |
                       (uVar20 & 0xff00) << 0x28 | uVar20 << 0x38;
              puVar14 = puVar14 + 1;
              uVar18 = uVar18 - 0x40;
            }
            iVar7 = 0x40;
            iVar12 = 0x40;
            uVar21 = uVar19;
          } while (iVar8 < 0x40);
        }
        iVar8 = iVar12;
        if (local_78 == 0) {
          if (pctxt != (exr_const_context_t_conflict)0x0) {
            (*pctxt->print_error)
                      (pctxt,0x17,"Huffman decode error (RLE code with no previous symbol)");
            auVar50 = _DAT_001848c0;
            auVar51 = _DAT_001848d0;
            auVar52 = _DAT_001848e0;
            auVar53 = _DAT_001848f0;
            auVar54 = _DAT_00184900;
          }
          local_78 = 0;
          bVar6 = false;
        }
        else {
          uVar21 = uVar19 >> 0x38;
          if (numDstElems < local_78 + uVar21) {
            if (pctxt != (exr_const_context_t_conflict)0x0) {
              pcVar13 = "Huffman decode error (Symbol run beyond expected output buffer length)";
LAB_0010da56:
              (*pctxt->print_error)(pctxt,0x17,pcVar13);
              auVar50 = _DAT_001848c0;
              auVar51 = _DAT_001848d0;
              auVar52 = _DAT_001848e0;
              auVar53 = _DAT_001848f0;
              auVar54 = _DAT_00184900;
            }
          }
          else {
            if (uVar21 != 0) {
              lVar10 = uVar21 - 1;
              auVar22._8_4_ = (int)lVar10;
              auVar22._0_8_ = lVar10;
              auVar22._12_4_ = (int)((ulong)lVar10 >> 0x20);
              lVar10 = local_78 * 2;
              auVar22 = auVar22 ^ auVar54;
              uVar16 = 0;
              auVar24 = auVar53;
              auVar26 = auVar52;
              auVar27 = auVar51;
              auVar28 = auVar50;
              do {
                auVar29 = auVar24 ^ auVar54;
                iVar8 = auVar22._0_4_;
                iVar42 = -(uint)(iVar8 < auVar29._0_4_);
                iVar11 = auVar22._4_4_;
                auVar30._4_4_ = -(uint)(iVar11 < auVar29._4_4_);
                iVar46 = auVar22._8_4_;
                iVar45 = -(uint)(iVar46 < auVar29._8_4_);
                iVar23 = auVar22._12_4_;
                auVar30._12_4_ = -(uint)(iVar23 < auVar29._12_4_);
                auVar39._4_4_ = iVar42;
                auVar39._0_4_ = iVar42;
                auVar39._8_4_ = iVar45;
                auVar39._12_4_ = iVar45;
                auVar47 = pshuflw(in_XMM8,auVar39,0xe8);
                auVar32._4_4_ = -(uint)(auVar29._4_4_ == iVar11);
                auVar32._12_4_ = -(uint)(auVar29._12_4_ == iVar23);
                auVar32._0_4_ = auVar32._4_4_;
                auVar32._8_4_ = auVar32._12_4_;
                auVar49 = pshuflw(in_XMM9,auVar32,0xe8);
                auVar30._0_4_ = auVar30._4_4_;
                auVar30._8_4_ = auVar30._12_4_;
                auVar48 = pshuflw(auVar47,auVar30,0xe8);
                auVar29._8_4_ = 0xffffffff;
                auVar29._0_8_ = 0xffffffffffffffff;
                auVar29._12_4_ = 0xffffffff;
                auVar29 = (auVar48 | auVar49 & auVar47) ^ auVar29;
                auVar29 = packssdw(auVar29,auVar29);
                uVar1 = dst[local_78 - 1];
                if ((auVar29 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  *(uint16_t *)((long)dst + uVar16 + lVar10) = uVar1;
                }
                auVar30 = auVar32 & auVar39 | auVar30;
                auVar29 = packssdw(auVar30,auVar30);
                auVar48._8_4_ = 0xffffffff;
                auVar48._0_8_ = 0xffffffffffffffff;
                auVar48._12_4_ = 0xffffffff;
                auVar29 = packssdw(auVar29 ^ auVar48,auVar29 ^ auVar48);
                if ((auVar29._0_4_ >> 0x10 & 1) != 0) {
                  *(uint16_t *)((long)dst + uVar16 + lVar10 + 2) = uVar1;
                }
                auVar29 = auVar26 ^ auVar54;
                iVar42 = -(uint)(iVar8 < auVar29._0_4_);
                auVar43._4_4_ = -(uint)(iVar11 < auVar29._4_4_);
                iVar45 = -(uint)(iVar46 < auVar29._8_4_);
                auVar43._12_4_ = -(uint)(iVar23 < auVar29._12_4_);
                auVar31._4_4_ = iVar42;
                auVar31._0_4_ = iVar42;
                auVar31._8_4_ = iVar45;
                auVar31._12_4_ = iVar45;
                auVar38._4_4_ = -(uint)(auVar29._4_4_ == iVar11);
                auVar38._12_4_ = -(uint)(auVar29._12_4_ == iVar23);
                auVar38._0_4_ = auVar38._4_4_;
                auVar38._8_4_ = auVar38._12_4_;
                auVar43._0_4_ = auVar43._4_4_;
                auVar43._8_4_ = auVar43._12_4_;
                auVar29 = auVar38 & auVar31 | auVar43;
                auVar29 = packssdw(auVar29,auVar29);
                auVar4._8_4_ = 0xffffffff;
                auVar4._0_8_ = 0xffffffffffffffff;
                auVar4._12_4_ = 0xffffffff;
                auVar29 = packssdw(auVar29 ^ auVar4,auVar29 ^ auVar4);
                if ((auVar29 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  *(uint16_t *)((long)dst + uVar16 + lVar10 + 4) = uVar1;
                }
                auVar32 = pshufhw(auVar31,auVar31,0x84);
                auVar39 = pshufhw(auVar38,auVar38,0x84);
                auVar30 = pshufhw(auVar32,auVar43,0x84);
                auVar33._8_4_ = 0xffffffff;
                auVar33._0_8_ = 0xffffffffffffffff;
                auVar33._12_4_ = 0xffffffff;
                auVar33 = (auVar30 | auVar39 & auVar32) ^ auVar33;
                auVar32 = packssdw(auVar33,auVar33);
                if ((auVar32 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  *(uint16_t *)((long)dst + uVar16 + lVar10 + 6) = uVar1;
                }
                auVar32 = auVar27 ^ auVar54;
                iVar42 = -(uint)(iVar8 < auVar32._0_4_);
                auVar35._4_4_ = -(uint)(iVar11 < auVar32._4_4_);
                iVar45 = -(uint)(iVar46 < auVar32._8_4_);
                auVar35._12_4_ = -(uint)(iVar23 < auVar32._12_4_);
                auVar40._4_4_ = iVar42;
                auVar40._0_4_ = iVar42;
                auVar40._8_4_ = iVar45;
                auVar40._12_4_ = iVar45;
                auVar29 = pshuflw(auVar29,auVar40,0xe8);
                auVar34._4_4_ = -(uint)(auVar32._4_4_ == iVar11);
                auVar34._12_4_ = -(uint)(auVar32._12_4_ == iVar23);
                auVar34._0_4_ = auVar34._4_4_;
                auVar34._8_4_ = auVar34._12_4_;
                auVar32 = pshuflw(auVar49 & auVar47,auVar34,0xe8);
                in_XMM9 = auVar32 & auVar29;
                auVar35._0_4_ = auVar35._4_4_;
                auVar35._8_4_ = auVar35._12_4_;
                auVar29 = pshuflw(auVar29,auVar35,0xe8);
                auVar47._8_4_ = 0xffffffff;
                auVar47._0_8_ = 0xffffffffffffffff;
                auVar47._12_4_ = 0xffffffff;
                auVar47 = (auVar29 | in_XMM9) ^ auVar47;
                auVar29 = packssdw(auVar47,auVar47);
                if ((auVar29 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  *(uint16_t *)((long)dst + uVar16 + lVar10 + 8) = uVar1;
                }
                auVar35 = auVar34 & auVar40 | auVar35;
                auVar29 = packssdw(auVar35,auVar35);
                auVar49._8_4_ = 0xffffffff;
                auVar49._0_8_ = 0xffffffffffffffff;
                auVar49._12_4_ = 0xffffffff;
                auVar29 = packssdw(auVar29 ^ auVar49,auVar29 ^ auVar49);
                if ((auVar29 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                  *(uint16_t *)((long)dst + uVar16 + lVar10 + 10) = uVar1;
                }
                auVar29 = auVar28 ^ auVar54;
                iVar8 = -(uint)(iVar8 < auVar29._0_4_);
                auVar44._4_4_ = -(uint)(iVar11 < auVar29._4_4_);
                iVar46 = -(uint)(iVar46 < auVar29._8_4_);
                auVar44._12_4_ = -(uint)(iVar23 < auVar29._12_4_);
                auVar36._4_4_ = iVar8;
                auVar36._0_4_ = iVar8;
                auVar36._8_4_ = iVar46;
                auVar36._12_4_ = iVar46;
                auVar41._4_4_ = -(uint)(auVar29._4_4_ == iVar11);
                auVar41._12_4_ = -(uint)(auVar29._12_4_ == iVar23);
                auVar41._0_4_ = auVar41._4_4_;
                auVar41._8_4_ = auVar41._12_4_;
                auVar44._0_4_ = auVar44._4_4_;
                auVar44._8_4_ = auVar44._12_4_;
                auVar29 = auVar41 & auVar36 | auVar44;
                auVar29 = packssdw(auVar29,auVar29);
                auVar5._8_4_ = 0xffffffff;
                auVar5._0_8_ = 0xffffffffffffffff;
                auVar5._12_4_ = 0xffffffff;
                in_XMM8 = packssdw(auVar29 ^ auVar5,auVar29 ^ auVar5);
                if ((in_XMM8 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  *(uint16_t *)((long)dst + uVar16 + lVar10 + 0xc) = uVar1;
                }
                auVar29 = pshufhw(auVar36,auVar36,0x84);
                auVar30 = pshufhw(auVar41,auVar41,0x84);
                auVar32 = pshufhw(auVar29,auVar44,0x84);
                auVar37._8_4_ = 0xffffffff;
                auVar37._0_8_ = 0xffffffffffffffff;
                auVar37._12_4_ = 0xffffffff;
                auVar37 = (auVar32 | auVar30 & auVar29) ^ auVar37;
                auVar29 = packssdw(auVar37,auVar37);
                if ((auVar29 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  *(uint16_t *)((long)dst + uVar16 + lVar10 + 0xe) = uVar1;
                }
                lVar25 = auVar24._8_8_;
                auVar24._0_8_ = auVar24._0_8_ + 8;
                auVar24._8_8_ = lVar25 + 8;
                lVar25 = auVar26._8_8_;
                auVar26._0_8_ = auVar26._0_8_ + 8;
                auVar26._8_8_ = lVar25 + 8;
                lVar25 = auVar27._8_8_;
                auVar27._0_8_ = auVar27._0_8_ + 8;
                auVar27._8_8_ = lVar25 + 8;
                lVar25 = auVar28._8_8_;
                auVar28._0_8_ = auVar28._0_8_ + 8;
                auVar28._8_8_ = lVar25 + 8;
                uVar16 = uVar16 + 0x10;
              } while (((uint)(byte)(uVar19 >> 0x38) * 2 + 0xe & 0xfffffff0) != uVar16);
              uVar19 = uVar19 << 8;
              bVar6 = true;
              local_78 = local_78 + uVar21;
              iVar8 = iVar12 + -8;
              goto LAB_0010d82e;
            }
            if (pctxt != (exr_const_context_t_conflict)0x0) {
              pcVar13 = "Huffman decode error (Invalid RLE length)";
              goto LAB_0010da56;
            }
          }
          bVar6 = false;
        }
LAB_0010d82e:
        if (!bVar6) {
          bVar6 = false;
          goto LAB_0010d920;
        }
      }
      else {
        dst[local_78] = (uint16_t)local_5c;
        local_78 = local_78 + 1;
      }
      bVar6 = true;
      uVar21 = uVar19;
      iVar12 = iVar7;
      if (iVar8 < 0xc) {
        do {
          uVar19 = uVar20;
          if (0 < iVar8) {
            iVar11 = 0x40 - iVar8;
            uVar19 = uVar21 | uVar20 >> ((byte)iVar8 & 0x3f);
            iVar7 = iVar12 - iVar11;
            if (iVar11 <= iVar12) {
              uVar20 = uVar20 << ((byte)iVar11 & 0x3f);
              iVar8 = 0x40;
              goto LAB_0010d920;
            }
            iVar12 = iVar8 + iVar12;
          }
          iVar8 = iVar12;
          if (uVar18 < 0x40) {
            if (uVar18 < 8) {
              bVar9 = 0x38;
              uVar20 = 0;
            }
            else {
              uVar21 = uVar18 - 8;
              bVar9 = 0x38;
              uVar20 = 0;
              puVar17 = puVar14;
              do {
                uVar20 = uVar20 | (ulong)(byte)*puVar17 << (bVar9 & 0x3f);
                puVar17 = (ulong *)((long)puVar17 + 1);
                bVar9 = bVar9 - 8;
                uVar18 = uVar18 - 8;
              } while (7 < uVar18);
              puVar14 = (ulong *)((long)puVar14 + (uVar21 >> 3) + 1);
            }
            if (uVar18 != 0) {
              uVar20 = uVar20 | (ulong)(byte)*puVar14 << (bVar9 & 0x3f);
              puVar14 = (ulong *)((long)puVar14 + 1);
              uVar18 = 0;
            }
          }
          else {
            uVar20 = *puVar14;
            uVar20 = uVar20 >> 0x38 | (uVar20 & 0xff000000000000) >> 0x28 |
                     (uVar20 & 0xff0000000000) >> 0x18 | (uVar20 & 0xff00000000) >> 8 |
                     (uVar20 & 0xff000000) << 8 | (uVar20 & 0xff0000) << 0x18 |
                     (uVar20 & 0xff00) << 0x28 | uVar20 << 0x38;
            puVar14 = puVar14 + 1;
            uVar18 = uVar18 - 0x40;
          }
          iVar7 = 0x40;
          uVar21 = uVar19;
          iVar12 = iVar7;
        } while (iVar8 < 0x40);
        iVar8 = 0x40;
      }
    }
LAB_0010d920:
    if (!bVar6) {
      return 0x17;
    }
  } while( true );
}

Assistant:

static exr_result_t
fasthuf_decode (
    exr_const_context_t         pctxt,
    FastHufDecoder* NO_ALIAS    fhd,
    const uint8_t* NO_ALIAS     src,
    uint64_t                    numSrcBits,
    uint16_t* NO_ALIAS          dst,
    uint64_t                    numDstElems)
{
    //
    // Current position (byte/bit) in the src data stream
    // (after the first buffer fill)
    //
    uint64_t buffer, bufferBack, dstIdx, tMin;
    int      bufferNumBits, bufferBackNumBits;
    uint32_t rleSym;

    const uint8_t* NO_ALIAS currByte = src + 2 * sizeof (uint64_t);

    numSrcBits -= 8 * 2 * sizeof (uint64_t);

    //
    // 64-bit buffer holding the current bits in the stream
    //

    buffer        = READ64 (src);
    bufferNumBits = 64;

    //
    // 64-bit buffer holding the next bits in the stream
    //

    bufferBack        = READ64 ((src + sizeof (uint64_t)));
    bufferBackNumBits = 64;
    dstIdx            = 0;

    tMin = fhd->_tableMin;
    rleSym = fhd->_rleSymbol;

    while (dstIdx < numDstElems)
    {
        int symbol, codeLen;

        //
        // Test if we can be table accelerated. If so, directly
        // lookup the output symbol. Otherwise, we need to fall
        // back to searching for the code.
        //
        // If we're doing table lookups, we don't really need
        // a re-filled buffer, so long as we have TABLE_LOOKUP_BITS
        // left. But for a search, we do need a refilled table.
        //

        if (tMin <= buffer)
        {
            int tableIdx = buffer >> INDEX_BIT_SHIFT;
            codeLen = fhd->_tableCodeLen[tableIdx];
            symbol  = fhd->_tableSymbol[tableIdx];
        }
        else
        {
            uint64_t id;

            if (bufferNumBits < 64)
            {
                FastHufDecoder_refill (
                    &buffer,
                    bufferNumBits,
                    &bufferBack,
                    &bufferBackNumBits,
                    &currByte,
                    &numSrcBits);
                bufferNumBits = 64;
            }

            //
            // Brute force search:
            // Find the smallest length where _ljBase[length] <= buffer
            //

            codeLen = TABLE_LOOKUP_BITS + 1;

            /* sentinel zero can never be greater than buffer */
            /* && codeLen <= _maxCodeLength */
            while (fhd->_ljBase[codeLen] > buffer)
                codeLen++;

            if (OUR_UNLIKELY(codeLen > fhd->_maxCodeLength))
            {
                if (pctxt)
                    pctxt->print_error (
                        pctxt,
                        EXR_ERR_CORRUPT_CHUNK,
                        "Huffman decode error (Decoded an invalid symbol)");
                return EXR_ERR_CORRUPT_CHUNK;
            }

            id = fhd->_ljOffset[codeLen] + (buffer >> (64 - codeLen));
            if (OUR_LIKELY(id < (uint64_t) fhd->_numSymbols))
            {
                symbol = fhd->_idToSymbol[id];
            }
            else
            {
                if (pctxt)
                    pctxt->print_error (
                        pctxt,
                        EXR_ERR_CORRUPT_CHUNK,
                        "Huffman decode error (Decoded an invalid symbol)");
                return EXR_ERR_CORRUPT_CHUNK;
            }

        }

        //
        // Shift over bit stream, and update the bit count in the buffer
        //

        buffer = buffer << codeLen;
        bufferNumBits -= codeLen;

        //
        // If we received a RLE symbol (_rleSymbol), then we need
        // to read ahead 8 bits to know how many times to repeat
        // the previous symbol. Need to ensure we at least have
        // 8 bits of data in the buffer
        //

        if (symbol == rleSym)
        {
            uint32_t rleCount;

            if (bufferNumBits < 8)
            {
                FastHufDecoder_refill (
                    &buffer,
                    bufferNumBits,
                    &bufferBack,
                    &bufferBackNumBits,
                    &currByte,
                    &numSrcBits);

                bufferNumBits = 64;
            }

            rleCount = buffer >> 56;

            if (OUR_UNLIKELY(dstIdx < 1))
            {
                if (pctxt)
                    pctxt->print_error (
                        pctxt,
                        EXR_ERR_CORRUPT_CHUNK,
                        "Huffman decode error (RLE code with no previous symbol)");
                return EXR_ERR_CORRUPT_CHUNK;
            }

            if (OUR_UNLIKELY(dstIdx + (uint64_t) rleCount > numDstElems))
            {
                if (pctxt)
                    pctxt->print_error (
                        pctxt,
                        EXR_ERR_CORRUPT_CHUNK,
                        "Huffman decode error (Symbol run beyond expected output buffer length)");
                return EXR_ERR_CORRUPT_CHUNK;
            }

            if (OUR_UNLIKELY(rleCount == 0 || rleCount >= (uint32_t)INT32_MAX))
            {
                if (pctxt)
                    pctxt->print_error (
                        pctxt,
                        EXR_ERR_CORRUPT_CHUNK,
                        "Huffman decode error (Invalid RLE length)");
                return EXR_ERR_CORRUPT_CHUNK;
            }

            for (uint32_t i = 0; i < rleCount; ++i)
                dst[dstIdx + (uint64_t) i] = dst[dstIdx - 1];

            dstIdx += rleCount;

            buffer = buffer << 8;
            bufferNumBits -= 8;
        }
        else
        {
            dst[dstIdx] = (uint16_t) symbol;
            dstIdx++;
        }

        //
        // refill bit stream buffer if we're below the number of
        // bits needed for a table lookup
        //

        if (bufferNumBits < TABLE_LOOKUP_BITS)
        {
            FastHufDecoder_refill (
                &buffer,
                bufferNumBits,
                &bufferBack,
                &bufferBackNumBits,
                &currByte,
                &numSrcBits);

            bufferNumBits = 64;
        }
    }

    if (OUR_UNLIKELY(numSrcBits != 0))
    {
        if (pctxt)
            pctxt->print_error (
                pctxt,
                EXR_ERR_CORRUPT_CHUNK,
                "Huffman decode error (%d bits of compressed data remains after filling expected output buffer)",
                (int) numSrcBits);
        return EXR_ERR_CORRUPT_CHUNK;
    }

    return EXR_ERR_SUCCESS;
}